

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Freudenthal_triangulation.h
# Opt level: O2

Simplex_handle * __thiscall
Gudhi::coxeter_triangulation::
Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
::locate_point<Eigen::Matrix<double,_1,1,0,_1,1>>
          (Simplex_handle *__return_storage_ptr__,void *this,Matrix<double,__1,_1,_0,__1,_1> *point,
          double scale)

{
  CoeffReturnType pdVar1;
  Scalar *pSVar2;
  long lVar3;
  invalid_argument *this_00;
  unsigned_long uVar4;
  size_t i_1;
  size_t i_2;
  size_t i;
  ulong uVar5;
  double dVar6;
  uint d;
  double local_b0;
  int y_i;
  undefined4 uStack_a4;
  Part indices;
  vector<double,_std::allocator<double>_> z;
  VectorXd x_vect;
  int y_i_1;
  undefined1 auStack_3c [12];
  
  d = (uint)(point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (*this == d) {
    (__return_storage_ptr__->partition_).
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->partition_).
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->partition_).
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    if (*(char *)((long)this + 0xd0) == '\x01') {
      for (uVar5 = 0; uVar5 < d; uVar5 = uVar5 + 1) {
        pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)point,
                            uVar5);
        local_b0 = *pdVar1 * scale;
        dVar6 = floor(local_b0);
        y_i = (int)dVar6;
        std::vector<int,_std::allocator<int>_>::push_back(&__return_storage_ptr__->vertex_,&y_i);
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(local_b0 - (double)y_i);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&z,(double *)&indices);
      }
    }
    else {
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&y_i,&d);
      for (uVar5 = 0; uVar5 < d; uVar5 = uVar5 + 1) {
        pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)point,
                            uVar5);
        local_b0 = *pdVar1;
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&y_i,uVar5
                           );
        *pSVar2 = local_b0;
      }
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&indices,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y_i,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)((long)this + 0x20));
      _y_i_1 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
               solve<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                           *)((long)this + 0x30),
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&indices);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x_vect,
                 (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&y_i_1);
      for (uVar5 = 0; uVar5 < d; uVar5 = uVar5 + 1) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x_vect,
                            uVar5);
        local_b0 = *pSVar2 * scale;
        dVar6 = floor(local_b0);
        y_i_1 = (int)dVar6;
        std::vector<int,_std::allocator<int>_>::push_back(&__return_storage_ptr__->vertex_,&y_i_1);
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(local_b0 - (double)y_i_1);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&z,(double *)&indices);
      }
      free(x_vect.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free((void *)CONCAT44(uStack_a4,y_i));
    }
    indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&z,(double *)&indices);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&indices,(ulong)(d + 1),(allocator_type *)&y_i);
    uVar4 = 0;
    for (lVar3 = 0;
        (pointer)((long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar3) !=
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish; lVar3 = lVar3 + 8) {
      indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = uVar4;
      uVar4 = uVar4 + 1;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::coxeter_triangulation::Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>::locate_point<Eigen::Matrix<double,_1,1,0,_1,1>>(Eigen::Matrix<double,_1,1,0,_1,1>const&,double)const::_lambda(unsigned_long,unsigned_long)_1_>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Coxeter_triangulation_include_gudhi_Freudenthal_triangulation_h:165:47)>
                )&z);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&y_i,1,
               indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,(allocator_type *)&x_vect);
    std::
    vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
    ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
              ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                *)&__return_storage_ptr__->partition_,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&y_i);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&y_i);
    lVar3 = 8;
    for (uVar5 = 1; uVar5 <= d; uVar5 = uVar5 + 1) {
      if (z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[*(long *)((long)indices.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar3 + -8)] <=
          z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[*(long *)((long)indices.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar3)] + 1e-09) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((__return_storage_ptr__->partition_).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1,
                   (value_type_conflict2 *)
                   ((long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar3));
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&y_i,1,
                   (value_type_conflict2 *)
                   ((long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar3),
                   (allocator_type *)&x_vect);
        std::
        vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
        ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    *)&__return_storage_ptr__->partition_,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&y_i);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&y_i);
      }
      lVar3 = lVar3 + 8;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&z.super__Vector_base<double,_std::allocator<double>_>);
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"The point must be of the same dimension as the triangulation");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Simplex_handle locate_point(const Point_d& point, double scale = 1) const {
    using Ordered_set_partition = typename Simplex_handle::OrderedSetPartition;
    using Part = typename Ordered_set_partition::value_type;
    unsigned d = point.size();
    GUDHI_CHECK(d == dimension_,
                std::invalid_argument("The point must be of the same dimension as the triangulation"));
    double error = 1e-9;
    Simplex_handle output;
    std::vector<double> z;
    if (is_freudenthal_) {
      for (std::size_t i = 0; i < d; i++) {
        double x_i = scale * point[i];
        int y_i = std::floor(x_i);
        output.vertex().push_back(y_i);
        z.push_back(x_i - y_i);
      }
    } else {
      Eigen::VectorXd p_vect(d);
      for (std::size_t i = 0; i < d; i++) p_vect(i) = point[i];
      Eigen::VectorXd x_vect = colpivhouseholderqr_.solve(p_vect - offset_);
      for (std::size_t i = 0; i < d; i++) {
        double x_i = scale * x_vect(i);
        int y_i = std::floor(x_i);
        output.vertex().push_back(y_i);
        z.push_back(x_i - y_i);
      }
    }
    z.push_back(0);
    Part indices(d + 1);
    std::iota(indices.begin(), indices.end(), 0);
    std::sort(indices.begin(), indices.end(), [&z](std::size_t i1, std::size_t i2) { return z[i1] > z[i2]; });

    output.partition().push_back(Part(1, indices[0]));
    for (std::size_t i = 1; i <= d; ++i)
      if (z[indices[i - 1]] > z[indices[i]] + error)
        output.partition().push_back(Part(1, indices[i]));
      else
        output.partition().back().push_back(indices[i]);
    return output;
  }